

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit_oram.h
# Opt level: O2

void __thiscall CircuitOram::flush(CircuitOram *this,int path)

{
  uint uVar1;
  Bucket<int> *pBVar2;
  int *piVar3;
  pointer ppBVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  char cVar9;
  int i;
  long lVar10;
  int i_2;
  int *piVar11;
  ulong uVar12;
  int i_1;
  ulong uVar13;
  allocator_type local_95;
  value_type_conflict local_94;
  vector<int,_std::allocator<int>_> target;
  vector<int,_std::allocator<int>_> deepest;
  vector<int,_std::allocator<int>_> deepest_depth;
  vector<int,_std::allocator<int>_> deepest_index;
  
  deepest_depth.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            (&deepest_index,(long)(this->super_TreeOram).logN + 1,
             (value_type_conflict *)&deepest_depth,(allocator_type *)&deepest);
  deepest.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            (&deepest_depth,(long)(this->super_TreeOram).logN + 1,(value_type_conflict *)&deepest,
             (allocator_type *)&target);
  target.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            (&deepest,(long)(this->super_TreeOram).logN + 1,(value_type_conflict *)&target,
             (allocator_type *)&local_94);
  local_94 = -1;
  std::vector<int,_std::allocator<int>_>::vector
            (&target,(long)(this->super_TreeOram).logN + 1,&local_94,&local_95);
  lVar10 = 0;
  uVar13 = 1;
  while( true ) {
    iVar7 = (this->super_TreeOram).h;
    uVar6 = (ulong)iVar7;
    if ((long)uVar6 < lVar10) break;
    cVar9 = (char)iVar7;
    pBVar2 = (this->super_TreeOram).tree.
             super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
             super__Vector_impl_data._M_start
             [(int)(1L << (cVar9 - 1U & 0x3f)) + path >> (cVar9 - (char)lVar10 & 0x1fU)];
    piVar3 = *(pointer *)((long)&pBVar2->blocks + 8);
    for (piVar11 = *(int **)&pBVar2->blocks; piVar11 != piVar3; piVar11 = piVar11 + 1) {
      iVar7 = *piVar11;
      if ((long)iVar7 != -1) {
        iVar5 = TreeOram::push_distance
                          (&this->super_TreeOram,path,
                           (this->super_TreeOram).index.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar7]);
        if (*(int *)(CONCAT44(deepest_depth.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              deepest_depth.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_) + lVar10 * 4) < iVar5) {
          deepest_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar10] = iVar7;
          *(int *)(CONCAT44(deepest_depth.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            deepest_depth.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_) + lVar10 * 4) = iVar5;
        }
      }
    }
    lVar10 = lVar10 + 1;
  }
  if (*deepest_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start == -1) {
    iVar7 = -1;
    uVar12 = 0xffffffff;
  }
  else {
    iVar7 = *(int *)CONCAT44(deepest_depth.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             deepest_depth.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._0_4_);
    uVar12 = 0;
  }
  for (; (long)uVar13 <= (long)(int)uVar6; uVar13 = uVar13 + 1) {
    if ((long)uVar13 <= (long)iVar7) {
      *(int *)(CONCAT44(deepest.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        deepest.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_) + uVar13 * 4) = (int)uVar12;
      uVar6 = (ulong)(uint)(this->super_TreeOram).h;
    }
    iVar5 = ((int *)CONCAT44(deepest_depth.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             deepest_depth.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._0_4_))[uVar13];
    if (iVar7 < iVar5) {
      uVar12 = uVar13 & 0xffffffff;
      iVar7 = iVar5;
    }
  }
  ppBVar4 = (this->super_TreeOram).tree.
            super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar7 = -(int)uVar6;
  uVar8 = 0xffffffff;
  uVar13 = 0xffffffff;
  uVar12 = uVar6 & 0xffffffff;
  while (iVar5 = (int)uVar12, -1 < iVar5) {
    if (iVar5 == (int)uVar8) {
      *(int *)(CONCAT44(target.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        target.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_) + uVar8 * 4) = (int)uVar13;
      uVar6 = (ulong)(uint)(this->super_TreeOram).h;
      uVar8 = 0xffffffff;
      uVar13 = 0xffffffff;
    }
    if (((((int)uVar13 == -1) &&
         (pBVar2 = ppBVar4[(int)(1L << ((char)uVar6 - 1U & 0x3f)) + path >>
                           ((char)uVar6 + (char)iVar7 & 0x1fU)],
         pBVar2->bsize <
         (int)((ulong)((long)*(pointer *)((long)&pBVar2->blocks + 8) - *(long *)&pBVar2->blocks) >>
              2))) ||
        (*(int *)(CONCAT44(target.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           target.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._0_4_) + uVar12 * 4) != -1)) &&
       (uVar1 = *(uint *)(CONCAT44(deepest.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,
                                   deepest.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._0_4_) + uVar12 * 4),
       uVar1 != 0xffffffff)) {
      uVar8 = (ulong)uVar1;
      uVar13 = uVar12;
    }
    iVar7 = iVar7 + 1;
    uVar12 = (ulong)(iVar5 - 1);
  }
  cVar9 = '\0';
  uVar13 = 0xffffffff;
  iVar7 = -1;
  for (uVar12 = 0; (long)uVar12 <= (long)(int)uVar6; uVar12 = uVar12 + 1) {
    if (iVar7 == -1) {
      iVar5 = -1;
      iVar7 = iVar5;
    }
    else if (uVar12 == uVar13) {
      uVar13 = 0xffffffff;
      iVar5 = -1;
    }
    else {
      iVar5 = iVar7;
      iVar7 = -1;
    }
    if (*(int *)(CONCAT44(target.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          target.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_) + uVar12 * 4) != -1) {
      iVar5 = deepest_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar12];
      Bucket<int>::readAndRemove
                ((this->super_TreeOram).tree.
                 super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [(int)(1L << ((char)uVar6 - 1U & 0x3f)) + path >> ((char)uVar6 + cVar9 & 0x1fU)],
                 iVar5);
      uVar13 = (ulong)*(uint *)(CONCAT44(target.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         target.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start._0_4_) +
                               uVar12 * 4);
      uVar6 = (ulong)(uint)(this->super_TreeOram).h;
    }
    if (iVar7 != -1) {
      Bucket<int>::add((this->super_TreeOram).tree.
                       super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
                       super__Vector_impl_data._M_start
                       [(int)(1L << ((char)uVar6 - 1U & 0x3f)) + path >>
                        ((char)uVar6 + cVar9 & 0x1fU)],iVar7);
      uVar6 = (ulong)(uint)(this->super_TreeOram).h;
    }
    cVar9 = cVar9 + -1;
    iVar7 = iVar5;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&target.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&deepest.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&deepest_depth.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&deepest_index.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void flush(int path)
      {
         vector<int> deepest_index(logN+1, -1);
         vector<int> deepest_depth(logN+1, -1);
         vector<int> deepest(logN+1, -1);
         vector<int> target(logN+1, -1);
         int src = -1, goal = -1;
         for(int i = 0; i <= h; ++i) {
            for(auto v : tree[bucketAt(path, i)]->blocks) {
               if(v!=-1) {
                  int d = push_distance(path, index[v]);
                  if(d > deepest_depth[i]) {
                     deepest_index[i] = v;
                     deepest_depth[i] = d;
                  }
               }
            }
         }

         if(deepest_index[0] != -1) {
            src = 0;
            goal = deepest_depth[0];
         }

         for(int  i = 1; i <=h; ++i) {
            if(goal >= i)
               deepest[i] = src;
            int l = deepest_depth[i];
            if(l > goal) {
               goal = l;
               src = i;
            }
         }

         int dest = -1; src = -1;
         for(int  i = h; i >= 0; --i) {
            if(i == src) {
               target[i] = dest;
               dest = -1;
               src = -1;
            }
            bool has_empty = tree[bucketAt(path, i)]->size() < tree[bucketAt(path, i)]->capacity();
            if( ( (dest == -1 and has_empty) or target[i]!=-1 ) and deepest[i]!=-1) {
               src = deepest[i];
               dest = i;
            }
         }
         dest = -1;
         int hold = -1;
         int to_write = -1;
         for(int i = 0; i <= h; ++i) {
            to_write = -1;
            if(hold != -1 and i == dest) {
               to_write = hold;
               hold = -1;
               dest = -1;
            }
            if(target[i]!=-1) {
               hold = deepest_index[i];
               tree[bucketAt(path, i)]->readAndRemove(deepest_index[i]);
               dest = target[i];
            }
            if(to_write != -1)
               tree[bucketAt(path, i)]->add(to_write);
         }
      }